

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::NullEventPort::wake(NullEventPort *this)

{
  char (*in_RCX) [78];
  String local_180;
  Exception local_168;
  NullEventPort *local_10;
  NullEventPort *this_local;
  
  local_10 = this;
  Debug::makeDescription<char_const(&)[78]>
            (&local_180,
             (Debug *)
             "\"Cross-thread events are not yet implemented for EventLoops with no EventPort.\"",
             "Cross-thread events are not yet implemented for EventLoops with no EventPort.",in_RCX)
  ;
  Exception::Exception
            (&local_168,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x11a,&local_180);
  throwRecoverableException(&local_168,0);
  Exception::~Exception(&local_168);
  String::~String(&local_180);
  return;
}

Assistant:

void wake() const override {
    // TODO(someday): Implement using condvar.
    kj::throwRecoverableException(KJ_EXCEPTION(UNIMPLEMENTED,
        "Cross-thread events are not yet implemented for EventLoops with no EventPort."));
  }